

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  NodeRef *local_15d0;
  undefined1 local_1548 [16];
  undefined1 (*local_1530) [16];
  long local_1528;
  long local_1520;
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_11f8._4_4_ = uVar1;
  local_11f8._0_4_ = uVar1;
  local_11f8._8_4_ = uVar1;
  local_11f8._12_4_ = uVar1;
  local_11f8._16_4_ = uVar1;
  local_11f8._20_4_ = uVar1;
  local_11f8._24_4_ = uVar1;
  local_11f8._28_4_ = uVar1;
  auVar58 = ZEXT3264(local_11f8);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = uVar1;
  local_1218._0_4_ = uVar1;
  local_1218._8_4_ = uVar1;
  local_1218._12_4_ = uVar1;
  local_1218._16_4_ = uVar1;
  local_1218._20_4_ = uVar1;
  local_1218._24_4_ = uVar1;
  local_1218._28_4_ = uVar1;
  auVar64 = ZEXT3264(local_1218);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = uVar1;
  local_1238._0_4_ = uVar1;
  local_1238._8_4_ = uVar1;
  local_1238._12_4_ = uVar1;
  local_1238._16_4_ = uVar1;
  local_1238._20_4_ = uVar1;
  local_1238._24_4_ = uVar1;
  local_1238._28_4_ = uVar1;
  auVar66 = ZEXT3264(local_1238);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar110 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar67 = fVar95 * 0.99999964;
  fVar78 = fVar103 * 0.99999964;
  fVar88 = fVar110 * 0.99999964;
  fVar95 = fVar95 * 1.0000004;
  fVar103 = fVar103 * 1.0000004;
  fVar110 = fVar110 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  local_1318._4_4_ = iVar2;
  local_1318._0_4_ = iVar2;
  local_1318._8_4_ = iVar2;
  local_1318._12_4_ = iVar2;
  local_1318._16_4_ = iVar2;
  local_1318._20_4_ = iVar2;
  local_1318._24_4_ = iVar2;
  local_1318._28_4_ = iVar2;
  auVar121 = ZEXT3264(local_1318);
  iVar2 = (tray->tfar).field_0.i[k];
  local_1338._4_4_ = iVar2;
  local_1338._0_4_ = iVar2;
  local_1338._8_4_ = iVar2;
  local_1338._12_4_ = iVar2;
  local_1338._16_4_ = iVar2;
  local_1338._20_4_ = iVar2;
  local_1338._24_4_ = iVar2;
  local_1338._28_4_ = iVar2;
  auVar122 = ZEXT3264(local_1338);
  local_1530 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1258 = fVar67;
  fStack_1254 = fVar67;
  fStack_1250 = fVar67;
  fStack_124c = fVar67;
  fStack_1248 = fVar67;
  fStack_1244 = fVar67;
  fStack_1240 = fVar67;
  fStack_123c = fVar67;
  local_1278 = fVar78;
  fStack_1274 = fVar78;
  fStack_1270 = fVar78;
  fStack_126c = fVar78;
  fStack_1268 = fVar78;
  fStack_1264 = fVar78;
  fStack_1260 = fVar78;
  fStack_125c = fVar78;
  local_1298 = fVar88;
  fStack_1294 = fVar88;
  fStack_1290 = fVar88;
  fStack_128c = fVar88;
  fStack_1288 = fVar88;
  fStack_1284 = fVar88;
  fStack_1280 = fVar88;
  fStack_127c = fVar88;
  local_12b8 = fVar95;
  fStack_12b4 = fVar95;
  fStack_12b0 = fVar95;
  fStack_12ac = fVar95;
  fStack_12a8 = fVar95;
  fStack_12a4 = fVar95;
  fStack_12a0 = fVar95;
  fStack_129c = fVar95;
  local_12d8 = fVar103;
  fStack_12d4 = fVar103;
  fStack_12d0 = fVar103;
  fStack_12cc = fVar103;
  fStack_12c8 = fVar103;
  fStack_12c4 = fVar103;
  fStack_12c0 = fVar103;
  fStack_12bc = fVar103;
  local_12f8 = fVar110;
  fStack_12f4 = fVar110;
  fStack_12f0 = fVar110;
  fStack_12ec = fVar110;
  fStack_12e8 = fVar110;
  fStack_12e4 = fVar110;
  fStack_12e0 = fVar110;
  fStack_12dc = fVar110;
  local_15d0 = stack + 1;
  fVar72 = fVar67;
  fVar73 = fVar67;
  fVar74 = fVar67;
  fVar75 = fVar67;
  fVar76 = fVar67;
  fVar77 = fVar67;
  fVar82 = fVar78;
  fVar83 = fVar78;
  fVar84 = fVar78;
  fVar85 = fVar78;
  fVar86 = fVar78;
  fVar87 = fVar78;
  fVar89 = fVar88;
  fVar90 = fVar88;
  fVar91 = fVar88;
  fVar92 = fVar88;
  fVar93 = fVar88;
  fVar94 = fVar88;
  fVar97 = fVar95;
  fVar98 = fVar95;
  fVar99 = fVar95;
  fVar100 = fVar95;
  fVar101 = fVar95;
  fVar102 = fVar95;
  fVar104 = fVar103;
  fVar105 = fVar103;
  fVar106 = fVar103;
  fVar107 = fVar103;
  fVar108 = fVar103;
  fVar109 = fVar103;
  fVar113 = fVar110;
  fVar114 = fVar110;
  fVar115 = fVar110;
  fVar116 = fVar110;
  fVar117 = fVar110;
  fVar118 = fVar110;
LAB_016656e7:
  do {
    pNVar21 = local_15d0;
    if (pNVar21 == stack) {
LAB_0166611b:
      return pNVar21 != stack;
    }
    local_15d0 = pNVar21 + -1;
    sVar24 = pNVar21[-1].ptr;
    while ((sVar24 & 8) == 0) {
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar31._4_4_ = uVar1;
      auVar31._0_4_ = uVar1;
      auVar31._8_4_ = uVar1;
      auVar31._12_4_ = uVar1;
      auVar31._16_4_ = uVar1;
      auVar31._20_4_ = uVar1;
      auVar31._24_4_ = uVar1;
      auVar31._28_4_ = uVar1;
      uVar16 = sVar24 & 0xfffffffffffffff0;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar23),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar23));
      auVar7 = vsubps_avx(ZEXT1632(auVar50),auVar58._0_32_);
      auVar8._4_4_ = fVar72 * auVar7._4_4_;
      auVar8._0_4_ = fVar67 * auVar7._0_4_;
      auVar8._8_4_ = fVar73 * auVar7._8_4_;
      auVar8._12_4_ = fVar74 * auVar7._12_4_;
      auVar8._16_4_ = fVar75 * auVar7._16_4_;
      auVar8._20_4_ = fVar76 * auVar7._20_4_;
      auVar8._24_4_ = fVar77 * auVar7._24_4_;
      auVar8._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar121._0_32_,auVar8);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar18),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar18));
      auVar8 = vsubps_avx(ZEXT1632(auVar50),auVar64._0_32_);
      auVar9._4_4_ = fVar82 * auVar8._4_4_;
      auVar9._0_4_ = fVar78 * auVar8._0_4_;
      auVar9._8_4_ = fVar83 * auVar8._8_4_;
      auVar9._12_4_ = fVar84 * auVar8._12_4_;
      auVar9._16_4_ = fVar85 * auVar8._16_4_;
      auVar9._20_4_ = fVar86 * auVar8._20_4_;
      auVar9._24_4_ = fVar87 * auVar8._24_4_;
      auVar9._28_4_ = auVar8._28_4_;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar25),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar25));
      auVar8 = vsubps_avx(ZEXT1632(auVar50),auVar66._0_32_);
      auVar12._4_4_ = fVar89 * auVar8._4_4_;
      auVar12._0_4_ = fVar88 * auVar8._0_4_;
      auVar12._8_4_ = fVar90 * auVar8._8_4_;
      auVar12._12_4_ = fVar91 * auVar8._12_4_;
      auVar12._16_4_ = fVar92 * auVar8._16_4_;
      auVar12._20_4_ = fVar93 * auVar8._20_4_;
      auVar12._24_4_ = fVar94 * auVar8._24_4_;
      auVar12._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar9,auVar12);
      auVar7 = vmaxps_avx(auVar7,auVar8);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar23 ^ 0x20)),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar23 ^ 0x20)));
      auVar8 = vsubps_avx(ZEXT1632(auVar50),auVar58._0_32_);
      auVar13._4_4_ = fVar97 * auVar8._4_4_;
      auVar13._0_4_ = fVar95 * auVar8._0_4_;
      auVar13._8_4_ = fVar98 * auVar8._8_4_;
      auVar13._12_4_ = fVar99 * auVar8._12_4_;
      auVar13._16_4_ = fVar100 * auVar8._16_4_;
      auVar13._20_4_ = fVar101 * auVar8._20_4_;
      auVar13._24_4_ = fVar102 * auVar8._24_4_;
      auVar13._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar122._0_32_,auVar13);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar18 ^ 0x20)),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar18 ^ 0x20)));
      auVar9 = vsubps_avx(ZEXT1632(auVar50),auVar64._0_32_);
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar25 ^ 0x20)),auVar31,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar25 ^ 0x20)));
      auVar14._4_4_ = fVar104 * auVar9._4_4_;
      auVar14._0_4_ = fVar103 * auVar9._0_4_;
      auVar14._8_4_ = fVar105 * auVar9._8_4_;
      auVar14._12_4_ = fVar106 * auVar9._12_4_;
      auVar14._16_4_ = fVar107 * auVar9._16_4_;
      auVar14._20_4_ = fVar108 * auVar9._20_4_;
      auVar14._24_4_ = fVar109 * auVar9._24_4_;
      auVar14._28_4_ = auVar9._28_4_;
      auVar9 = vsubps_avx(ZEXT1632(auVar50),auVar66._0_32_);
      auVar15._4_4_ = fVar113 * auVar9._4_4_;
      auVar15._0_4_ = fVar110 * auVar9._0_4_;
      auVar15._8_4_ = fVar114 * auVar9._8_4_;
      auVar15._12_4_ = fVar115 * auVar9._12_4_;
      auVar15._16_4_ = fVar116 * auVar9._16_4_;
      auVar15._20_4_ = fVar117 * auVar9._20_4_;
      auVar15._24_4_ = fVar118 * auVar9._24_4_;
      auVar15._28_4_ = auVar9._28_4_;
      auVar9 = vminps_avx(auVar14,auVar15);
      auVar8 = vminps_avx(auVar8,auVar9);
      auVar7 = vcmpps_avx(auVar7,auVar8,2);
      if (((uint)sVar24 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar16 + 0x1c0),auVar31,2);
        auVar9 = vcmpps_avx(auVar31,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar9);
        auVar7 = vandps_avx(auVar8,auVar7);
        auVar50 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      else {
        auVar50 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      auVar26 = vpsllw_avx(auVar50,0xf);
      auVar50 = vpacksswb_avx(auVar26,auVar26);
      bVar10 = SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar50 >> 0x17,0) & 1) << 2 | (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar50 >> 0x27,0) & 1) << 4 | (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar50 >> 0x37,0) & 1) << 6 | SUB161(auVar50 >> 0x3f,0) << 7;
      if ((((((((auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf])
      goto LAB_016656e7;
      lVar17 = 0;
      for (uVar20 = (ulong)bVar10; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      sVar24 = *(size_t *)(uVar16 + lVar17 * 8);
      uVar19 = bVar10 - 1 & (uint)bVar10;
      uVar20 = (ulong)uVar19;
      if (uVar19 != 0) {
        do {
          local_15d0->ptr = sVar24;
          local_15d0 = local_15d0 + 1;
          lVar17 = 0;
          for (uVar11 = uVar20; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar20 = uVar20 - 1 & uVar20;
          sVar24 = *(size_t *)(uVar16 + lVar17 * 8);
        } while (uVar20 != 0);
      }
    }
    local_1520 = (ulong)((uint)sVar24 & 0xf) - 8;
    uVar16 = sVar24 & 0xfffffffffffffff0;
    for (local_1528 = 0; local_1528 != local_1520; local_1528 = local_1528 + 1) {
      lVar17 = local_1528 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar46._4_4_ = uVar1;
      auVar46._0_4_ = uVar1;
      auVar46._8_4_ = uVar1;
      auVar46._12_4_ = uVar1;
      auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x90 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + lVar17));
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xa0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x10 + lVar17));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xb0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + lVar17));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xc0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x30 + lVar17));
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xd0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x40 + lVar17));
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xe0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x50 + lVar17));
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0xf0 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x60 + lVar17));
      auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x100 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x70 + lVar17));
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x110 + lVar17),auVar46,
                                *(undefined1 (*) [16])(uVar16 + 0x80 + lVar17));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar47._4_4_ = uVar1;
      auVar47._0_4_ = uVar1;
      auVar47._8_4_ = uVar1;
      auVar47._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar111._4_4_ = uVar1;
      auVar111._0_4_ = uVar1;
      auVar111._8_4_ = uVar1;
      auVar111._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar119._4_4_ = uVar1;
      auVar119._0_4_ = uVar1;
      auVar119._8_4_ = uVar1;
      auVar119._12_4_ = uVar1;
      auVar46 = vsubps_avx(auVar50,auVar47);
      auVar63 = vsubps_avx(auVar26,auVar111);
      auVar50 = vsubps_avx(auVar39,auVar119);
      auVar26 = vsubps_avx(auVar33,auVar47);
      auVar39 = vsubps_avx(auVar52,auVar111);
      auVar33 = vsubps_avx(auVar53,auVar119);
      auVar52 = vsubps_avx(auVar40,auVar47);
      auVar53 = vsubps_avx(auVar57,auVar111);
      auVar40 = vsubps_avx(auVar80,auVar119);
      auVar57 = vsubps_avx(auVar52,auVar46);
      auVar80 = vsubps_avx(auVar53,auVar63);
      auVar47 = vsubps_avx(auVar40,auVar50);
      auVar27._0_4_ = auVar52._0_4_ + auVar46._0_4_;
      auVar27._4_4_ = auVar52._4_4_ + auVar46._4_4_;
      auVar27._8_4_ = auVar52._8_4_ + auVar46._8_4_;
      auVar27._12_4_ = auVar52._12_4_ + auVar46._12_4_;
      auVar43._0_4_ = auVar53._0_4_ + auVar63._0_4_;
      auVar43._4_4_ = auVar53._4_4_ + auVar63._4_4_;
      auVar43._8_4_ = auVar53._8_4_ + auVar63._8_4_;
      auVar43._12_4_ = auVar53._12_4_ + auVar63._12_4_;
      fVar103 = auVar50._0_4_;
      auVar48._0_4_ = auVar40._0_4_ + fVar103;
      fVar110 = auVar50._4_4_;
      auVar48._4_4_ = auVar40._4_4_ + fVar110;
      fVar67 = auVar50._8_4_;
      auVar48._8_4_ = auVar40._8_4_ + fVar67;
      fVar78 = auVar50._12_4_;
      auVar48._12_4_ = auVar40._12_4_ + fVar78;
      auVar112._0_4_ = auVar47._0_4_ * auVar43._0_4_;
      auVar112._4_4_ = auVar47._4_4_ * auVar43._4_4_;
      auVar112._8_4_ = auVar47._8_4_ * auVar43._8_4_;
      auVar112._12_4_ = auVar47._12_4_ * auVar43._12_4_;
      auVar111 = vfmsub231ps_fma(auVar112,auVar80,auVar48);
      auVar49._0_4_ = auVar48._0_4_ * auVar57._0_4_;
      auVar49._4_4_ = auVar48._4_4_ * auVar57._4_4_;
      auVar49._8_4_ = auVar48._8_4_ * auVar57._8_4_;
      auVar49._12_4_ = auVar48._12_4_ * auVar57._12_4_;
      auVar48 = vfmsub231ps_fma(auVar49,auVar47,auVar27);
      auVar28._0_4_ = auVar80._0_4_ * auVar27._0_4_;
      auVar28._4_4_ = auVar80._4_4_ * auVar27._4_4_;
      auVar28._8_4_ = auVar80._8_4_ * auVar27._8_4_;
      auVar28._12_4_ = auVar80._12_4_ * auVar27._12_4_;
      auVar27 = vfmsub231ps_fma(auVar28,auVar57,auVar43);
      fVar95 = *(float *)(ray + k * 4 + 0x60);
      auVar79._0_4_ = auVar27._0_4_ * fVar95;
      auVar79._4_4_ = auVar27._4_4_ * fVar95;
      auVar79._8_4_ = auVar27._8_4_ * fVar95;
      auVar79._12_4_ = auVar27._12_4_ * fVar95;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar96._4_4_ = uVar1;
      auVar96._0_4_ = uVar1;
      auVar96._8_4_ = uVar1;
      auVar96._12_4_ = uVar1;
      auVar48 = vfmadd231ps_fma(auVar79,auVar96,auVar48);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar120._4_4_ = uVar1;
      auVar120._0_4_ = uVar1;
      auVar120._8_4_ = uVar1;
      auVar120._12_4_ = uVar1;
      auVar43 = vfmadd231ps_fma(auVar48,auVar120,auVar111);
      auVar48 = vsubps_avx(auVar63,auVar39);
      auVar111 = vsubps_avx(auVar50,auVar33);
      auVar44._0_4_ = auVar63._0_4_ + auVar39._0_4_;
      auVar44._4_4_ = auVar63._4_4_ + auVar39._4_4_;
      auVar44._8_4_ = auVar63._8_4_ + auVar39._8_4_;
      auVar44._12_4_ = auVar63._12_4_ + auVar39._12_4_;
      auVar50._0_4_ = fVar103 + auVar33._0_4_;
      auVar50._4_4_ = fVar110 + auVar33._4_4_;
      auVar50._8_4_ = fVar67 + auVar33._8_4_;
      auVar50._12_4_ = fVar78 + auVar33._12_4_;
      fVar88 = auVar111._0_4_;
      auVar59._0_4_ = auVar44._0_4_ * fVar88;
      fVar74 = auVar111._4_4_;
      auVar59._4_4_ = auVar44._4_4_ * fVar74;
      fVar77 = auVar111._8_4_;
      auVar59._8_4_ = auVar44._8_4_ * fVar77;
      fVar84 = auVar111._12_4_;
      auVar59._12_4_ = auVar44._12_4_ * fVar84;
      auVar28 = vfmsub231ps_fma(auVar59,auVar48,auVar50);
      auVar27 = vsubps_avx(auVar46,auVar26);
      fVar72 = auVar27._0_4_;
      auVar51._0_4_ = auVar50._0_4_ * fVar72;
      fVar75 = auVar27._4_4_;
      auVar51._4_4_ = auVar50._4_4_ * fVar75;
      fVar82 = auVar27._8_4_;
      auVar51._8_4_ = auVar50._8_4_ * fVar82;
      fVar85 = auVar27._12_4_;
      auVar51._12_4_ = auVar50._12_4_ * fVar85;
      auVar68._0_4_ = auVar46._0_4_ + auVar26._0_4_;
      auVar68._4_4_ = auVar46._4_4_ + auVar26._4_4_;
      auVar68._8_4_ = auVar46._8_4_ + auVar26._8_4_;
      auVar68._12_4_ = auVar46._12_4_ + auVar26._12_4_;
      auVar50 = vfmsub231ps_fma(auVar51,auVar111,auVar68);
      fVar73 = auVar48._0_4_;
      auVar69._0_4_ = auVar68._0_4_ * fVar73;
      fVar76 = auVar48._4_4_;
      auVar69._4_4_ = auVar68._4_4_ * fVar76;
      fVar83 = auVar48._8_4_;
      auVar69._8_4_ = auVar68._8_4_ * fVar83;
      fVar86 = auVar48._12_4_;
      auVar69._12_4_ = auVar68._12_4_ * fVar86;
      auVar44 = vfmsub231ps_fma(auVar69,auVar27,auVar44);
      auVar45._0_4_ = auVar44._0_4_ * fVar95;
      auVar45._4_4_ = auVar44._4_4_ * fVar95;
      auVar45._8_4_ = auVar44._8_4_ * fVar95;
      auVar45._12_4_ = auVar44._12_4_ * fVar95;
      auVar50 = vfmadd231ps_fma(auVar45,auVar96,auVar50);
      auVar44 = vfmadd231ps_fma(auVar50,auVar120,auVar28);
      auVar28 = vsubps_avx(auVar26,auVar52);
      auVar38._0_4_ = auVar26._0_4_ + auVar52._0_4_;
      auVar38._4_4_ = auVar26._4_4_ + auVar52._4_4_;
      auVar38._8_4_ = auVar26._8_4_ + auVar52._8_4_;
      auVar38._12_4_ = auVar26._12_4_ + auVar52._12_4_;
      auVar52 = vsubps_avx(auVar39,auVar53);
      auVar32._0_4_ = auVar39._0_4_ + auVar53._0_4_;
      auVar32._4_4_ = auVar39._4_4_ + auVar53._4_4_;
      auVar32._8_4_ = auVar39._8_4_ + auVar53._8_4_;
      auVar32._12_4_ = auVar39._12_4_ + auVar53._12_4_;
      auVar53 = vsubps_avx(auVar33,auVar40);
      auVar54._0_4_ = auVar33._0_4_ + auVar40._0_4_;
      auVar54._4_4_ = auVar33._4_4_ + auVar40._4_4_;
      auVar54._8_4_ = auVar33._8_4_ + auVar40._8_4_;
      auVar54._12_4_ = auVar33._12_4_ + auVar40._12_4_;
      auVar26._0_4_ = auVar53._0_4_ * auVar32._0_4_;
      auVar26._4_4_ = auVar53._4_4_ * auVar32._4_4_;
      auVar26._8_4_ = auVar53._8_4_ * auVar32._8_4_;
      auVar26._12_4_ = auVar53._12_4_ * auVar32._12_4_;
      auVar26 = vfmsub231ps_fma(auVar26,auVar52,auVar54);
      auVar55._0_4_ = auVar54._0_4_ * auVar28._0_4_;
      auVar55._4_4_ = auVar54._4_4_ * auVar28._4_4_;
      auVar55._8_4_ = auVar54._8_4_ * auVar28._8_4_;
      auVar55._12_4_ = auVar54._12_4_ * auVar28._12_4_;
      auVar50 = vfmsub231ps_fma(auVar55,auVar53,auVar38);
      auVar39._0_4_ = auVar52._0_4_ * auVar38._0_4_;
      auVar39._4_4_ = auVar52._4_4_ * auVar38._4_4_;
      auVar39._8_4_ = auVar52._8_4_ * auVar38._8_4_;
      auVar39._12_4_ = auVar52._12_4_ * auVar38._12_4_;
      auVar39 = vfmsub231ps_fma(auVar39,auVar28,auVar32);
      auVar33._0_4_ = auVar39._0_4_ * fVar95;
      auVar33._4_4_ = auVar39._4_4_ * fVar95;
      auVar33._8_4_ = auVar39._8_4_ * fVar95;
      auVar33._12_4_ = auVar39._12_4_ * fVar95;
      auVar50 = vfmadd231ps_fma(auVar33,auVar96,auVar50);
      auVar33 = vfmadd231ps_fma(auVar50,auVar120,auVar26);
      auVar65._0_4_ = auVar33._0_4_ + auVar43._0_4_ + auVar44._0_4_;
      auVar65._4_4_ = auVar33._4_4_ + auVar43._4_4_ + auVar44._4_4_;
      auVar65._8_4_ = auVar33._8_4_ + auVar43._8_4_ + auVar44._8_4_;
      auVar65._12_4_ = auVar33._12_4_ + auVar43._12_4_ + auVar44._12_4_;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar50 = vminps_avx(auVar43,auVar44);
      auVar26 = vminps_avx(auVar50,auVar33);
      auVar50 = vandps_avx(auVar65,auVar40);
      auVar70._0_4_ = auVar50._0_4_ * 1.1920929e-07;
      auVar70._4_4_ = auVar50._4_4_ * 1.1920929e-07;
      auVar70._8_4_ = auVar50._8_4_ * 1.1920929e-07;
      auVar70._12_4_ = auVar50._12_4_ * 1.1920929e-07;
      uVar20 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
      auVar60._0_8_ = uVar20 ^ 0x8000000080000000;
      auVar60._8_4_ = -auVar70._8_4_;
      auVar60._12_4_ = -auVar70._12_4_;
      auVar26 = vcmpps_avx(auVar26,auVar60,5);
      auVar39 = vmaxps_avx(auVar43,auVar44);
      auVar39 = vmaxps_avx(auVar39,auVar33);
      auVar39 = vcmpps_avx(auVar39,auVar70,2);
      auVar26 = vorps_avx(auVar26,auVar39);
      if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0'
         ) {
        auVar34._0_4_ = auVar47._0_4_ * fVar73;
        auVar34._4_4_ = auVar47._4_4_ * fVar76;
        auVar34._8_4_ = auVar47._8_4_ * fVar83;
        auVar34._12_4_ = auVar47._12_4_ * fVar86;
        auVar56._0_4_ = fVar72 * auVar80._0_4_;
        auVar56._4_4_ = fVar75 * auVar80._4_4_;
        auVar56._8_4_ = fVar82 * auVar80._8_4_;
        auVar56._12_4_ = fVar85 * auVar80._12_4_;
        auVar80 = vfmsub213ps_fma(auVar80,auVar111,auVar34);
        auVar61._0_4_ = auVar52._0_4_ * fVar88;
        auVar61._4_4_ = auVar52._4_4_ * fVar74;
        auVar61._8_4_ = auVar52._8_4_ * fVar77;
        auVar61._12_4_ = auVar52._12_4_ * fVar84;
        auVar71._0_4_ = fVar72 * auVar53._0_4_;
        auVar71._4_4_ = fVar75 * auVar53._4_4_;
        auVar71._8_4_ = fVar82 * auVar53._8_4_;
        auVar71._12_4_ = fVar85 * auVar53._12_4_;
        auVar53 = vfmsub213ps_fma(auVar53,auVar48,auVar61);
        auVar39 = vandps_avx(auVar34,auVar40);
        auVar33 = vandps_avx(auVar61,auVar40);
        auVar39 = vcmpps_avx(auVar39,auVar33,1);
        local_13f8 = vblendvps_avx(auVar53,auVar80,auVar39);
        auVar62._0_4_ = auVar28._0_4_ * fVar73;
        auVar62._4_4_ = auVar28._4_4_ * fVar76;
        auVar62._8_4_ = auVar28._8_4_ * fVar83;
        auVar62._12_4_ = auVar28._12_4_ * fVar86;
        auVar53 = vfmsub213ps_fma(auVar28,auVar111,auVar71);
        auVar35._0_4_ = auVar57._0_4_ * fVar88;
        auVar35._4_4_ = auVar57._4_4_ * fVar74;
        auVar35._8_4_ = auVar57._8_4_ * fVar77;
        auVar35._12_4_ = auVar57._12_4_ * fVar84;
        auVar80 = vfmsub213ps_fma(auVar47,auVar27,auVar35);
        auVar39 = vandps_avx(auVar35,auVar40);
        auVar33 = vandps_avx(auVar71,auVar40);
        auVar39 = vcmpps_avx(auVar39,auVar33,1);
        local_13e8 = vblendvps_avx(auVar53,auVar80,auVar39);
        auVar53 = vfmsub213ps_fma(auVar57,auVar48,auVar56);
        auVar52 = vfmsub213ps_fma(auVar52,auVar27,auVar62);
        auVar39 = vandps_avx(auVar56,auVar40);
        auVar33 = vandps_avx(auVar62,auVar40);
        auVar39 = vcmpps_avx(auVar39,auVar33,1);
        local_13d8 = vblendvps_avx(auVar52,auVar53,auVar39);
        auVar52._0_4_ = local_13d8._0_4_ * fVar95;
        auVar52._4_4_ = local_13d8._4_4_ * fVar95;
        auVar52._8_4_ = local_13d8._8_4_ * fVar95;
        auVar52._12_4_ = local_13d8._12_4_ * fVar95;
        auVar39 = vfmadd213ps_fma(auVar96,local_13e8,auVar52);
        auVar39 = vfmadd213ps_fma(auVar120,local_13f8,auVar39);
        auVar57._0_4_ = auVar39._0_4_ + auVar39._0_4_;
        auVar57._4_4_ = auVar39._4_4_ + auVar39._4_4_;
        auVar57._8_4_ = auVar39._8_4_ + auVar39._8_4_;
        auVar57._12_4_ = auVar39._12_4_ + auVar39._12_4_;
        auVar53._0_4_ = local_13d8._0_4_ * fVar103;
        auVar53._4_4_ = local_13d8._4_4_ * fVar110;
        auVar53._8_4_ = local_13d8._8_4_ * fVar67;
        auVar53._12_4_ = local_13d8._12_4_ * fVar78;
        auVar39 = vfmadd213ps_fma(auVar63,local_13e8,auVar53);
        auVar46 = vfmadd213ps_fma(auVar46,local_13f8,auVar39);
        auVar39 = vrcpps_avx(auVar57);
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = 0x3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar63 = vfnmadd213ps_fma(auVar39,auVar57,auVar80);
        auVar39 = vfmadd132ps_fma(auVar63,auVar39,auVar39);
        local_1408._0_4_ = auVar39._0_4_ * (auVar46._0_4_ + auVar46._0_4_);
        local_1408._4_4_ = auVar39._4_4_ * (auVar46._4_4_ + auVar46._4_4_);
        local_1408._8_4_ = auVar39._8_4_ * (auVar46._8_4_ + auVar46._8_4_);
        local_1408._12_4_ = auVar39._12_4_ * (auVar46._12_4_ + auVar46._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar63._4_4_ = uVar1;
        auVar63._0_4_ = uVar1;
        auVar63._8_4_ = uVar1;
        auVar63._12_4_ = uVar1;
        auVar39 = vcmpps_avx(auVar63,local_1408,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar81._4_4_ = uVar1;
        auVar81._0_4_ = uVar1;
        auVar81._8_4_ = uVar1;
        auVar81._12_4_ = uVar1;
        auVar58 = ZEXT1664(auVar81);
        auVar46 = vcmpps_avx(local_1408,auVar81,2);
        auVar39 = vandps_avx(auVar46,auVar39);
        auVar46 = auVar26 & auVar39;
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          auVar26 = vandps_avx(auVar26,auVar39);
          auVar39 = vcmpps_avx(auVar57,_DAT_01f45a50,4);
          auVar26 = vandps_avx(auVar26,auVar39);
          uVar19 = vmovmskps_avx(auVar26);
          if (uVar19 != 0) {
            pSVar4 = context->scene;
            auVar26 = vrcpps_avx(auVar65);
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar39 = vfnmadd213ps_fma(auVar65,auVar26,auVar41);
            auVar26 = vfmadd132ps_fma(auVar39,auVar26,auVar26);
            auVar36._8_4_ = 0x219392ef;
            auVar36._0_8_ = 0x219392ef219392ef;
            auVar36._12_4_ = 0x219392ef;
            auVar50 = vcmpps_avx(auVar50,auVar36,5);
            auVar50 = vandps_avx(auVar50,auVar26);
            auVar29._0_4_ = auVar43._0_4_ * auVar50._0_4_;
            auVar29._4_4_ = auVar43._4_4_ * auVar50._4_4_;
            auVar29._8_4_ = auVar43._8_4_ * auVar50._8_4_;
            auVar29._12_4_ = auVar43._12_4_ * auVar50._12_4_;
            local_1428 = vminps_avx(auVar29,auVar41);
            auVar30._0_4_ = auVar50._0_4_ * auVar44._0_4_;
            auVar30._4_4_ = auVar50._4_4_ * auVar44._4_4_;
            auVar30._8_4_ = auVar50._8_4_ * auVar44._8_4_;
            auVar30._12_4_ = auVar50._12_4_ * auVar44._12_4_;
            local_1418 = vminps_avx(auVar30,auVar41);
            uVar20 = (ulong)(uVar19 & 0xff);
            do {
              uVar11 = 0;
              for (uVar22 = uVar20; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                uVar11 = uVar11 + 1;
              }
              uVar19 = *(uint *)(lVar17 + uVar16 + 0x120 + uVar11 * 4);
              pGVar5 = (pSVar4->geometries).items[uVar19].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar22 = (ulong)(uint)((int)uVar11 * 4);
                  local_1398 = *(undefined4 *)(local_1428 + uVar22);
                  uVar1 = *(undefined4 *)(local_1418 + uVar22);
                  local_1388._4_4_ = uVar1;
                  local_1388._0_4_ = uVar1;
                  local_1388._8_4_ = uVar1;
                  local_1388._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar22);
                  args.context = context->user;
                  local_1368._4_4_ = uVar19;
                  local_1368._0_4_ = uVar19;
                  local_1368._8_4_ = uVar19;
                  local_1368._12_4_ = uVar19;
                  uVar1 = *(undefined4 *)(lVar17 + uVar16 + 0x130 + uVar22);
                  local_1378._4_4_ = uVar1;
                  local_1378._0_4_ = uVar1;
                  local_1378._8_4_ = uVar1;
                  local_1378._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_13f8 + uVar22);
                  uVar3 = *(undefined4 *)(local_13e8 + uVar22);
                  local_13b8._4_4_ = uVar3;
                  local_13b8._0_4_ = uVar3;
                  local_13b8._8_4_ = uVar3;
                  local_13b8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_13d8 + uVar22);
                  local_13a8._4_4_ = uVar3;
                  local_13a8._0_4_ = uVar3;
                  local_13a8._8_4_ = uVar3;
                  local_13a8._12_4_ = uVar3;
                  local_13c8[0] = (RTCHitN)(char)uVar1;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar1;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar1;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar1;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1548 = *local_1530;
                  args.valid = (int *)local_1548;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar50 = auVar58._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&args);
                    auVar58 = ZEXT1664(auVar50);
                  }
                  if (local_1548 == (undefined1  [16])0x0) {
                    auVar50 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar50 = auVar50 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&args);
                      auVar58 = ZEXT1664(auVar50);
                    }
                    auVar26 = vpcmpeqd_avx(local_1548,_DAT_01f45a50);
                    auVar50 = auVar26 ^ _DAT_01f46b70;
                    auVar42._8_4_ = 0xff800000;
                    auVar42._0_8_ = 0xff800000ff800000;
                    auVar42._12_4_ = 0xff800000;
                    auVar26 = vblendvps_avx(auVar42,*(undefined1 (*) [16])(args.ray + 0x80),auVar26)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar26;
                  }
                  auVar37._8_8_ = 0x100000001;
                  auVar37._0_8_ = 0x100000001;
                  if ((auVar37 & auVar50) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar58._0_4_;
                    goto LAB_0166602c;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0166611b;
              }
LAB_0166602c:
              uVar20 = uVar20 ^ 1L << (uVar11 & 0x3f);
            } while (uVar20 != 0);
          }
        }
      }
      auVar58 = ZEXT3264(local_11f8);
      auVar64 = ZEXT3264(local_1218);
      auVar66 = ZEXT3264(local_1238);
      auVar121 = ZEXT3264(local_1318);
      auVar122 = ZEXT3264(local_1338);
      fVar67 = local_1258;
      fVar72 = fStack_1254;
      fVar73 = fStack_1250;
      fVar74 = fStack_124c;
      fVar75 = fStack_1248;
      fVar76 = fStack_1244;
      fVar77 = fStack_1240;
      fVar78 = local_1278;
      fVar82 = fStack_1274;
      fVar83 = fStack_1270;
      fVar84 = fStack_126c;
      fVar85 = fStack_1268;
      fVar86 = fStack_1264;
      fVar87 = fStack_1260;
      fVar88 = local_1298;
      fVar89 = fStack_1294;
      fVar90 = fStack_1290;
      fVar91 = fStack_128c;
      fVar92 = fStack_1288;
      fVar93 = fStack_1284;
      fVar94 = fStack_1280;
      fVar95 = local_12b8;
      fVar97 = fStack_12b4;
      fVar98 = fStack_12b0;
      fVar99 = fStack_12ac;
      fVar100 = fStack_12a8;
      fVar101 = fStack_12a4;
      fVar102 = fStack_12a0;
      fVar103 = local_12d8;
      fVar104 = fStack_12d4;
      fVar105 = fStack_12d0;
      fVar106 = fStack_12cc;
      fVar107 = fStack_12c8;
      fVar108 = fStack_12c4;
      fVar109 = fStack_12c0;
      fVar110 = local_12f8;
      fVar113 = fStack_12f4;
      fVar114 = fStack_12f0;
      fVar115 = fStack_12ec;
      fVar116 = fStack_12e8;
      fVar117 = fStack_12e4;
      fVar118 = fStack_12e0;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }